

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::IsRFC3964(CNetAddr *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  undefined2 local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV6) {
    local_a = 0x220;
    uVar1 = (this->m_addr)._size;
    uVar4 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar4 = uVar1;
    }
    if (1 < uVar4) {
      if (0x10 < uVar1) {
        this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      if ((this->m_addr)._union.direct[0] == ' ') {
        lVar5 = 0;
        do {
          bVar6 = lVar5 == 1;
          if (bVar6) goto LAB_006a9c04;
          lVar2 = lVar5 + 1;
          lVar3 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (*(char *)((long)&local_a + lVar2) == (this->m_addr)._union.direct[lVar3]);
      }
    }
  }
  bVar6 = false;
LAB_006a9c04:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC3964() const
{
    return IsIPv6() && HasPrefix(m_addr, std::array<uint8_t, 2>{0x20, 0x02});
}